

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void run_proper_context_tests(int use_prealloc)

{
  char cVar1;
  uint uVar2;
  _func_void_char_ptr_void_ptr *p_Var3;
  int iVar4;
  secp256k1_context *psVar5;
  secp256k1_context *psVar6;
  secp256k1_context *psVar7;
  secp256k1_context *psVar8;
  code *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  long lVar9;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  code *extraout_RAX_07;
  code *pcVar10;
  code *unaff_RBX;
  secp256k1_context *psVar11;
  secp256k1_context *unaff_RBP;
  code *unaff_R14;
  bool bVar12;
  int32_t dummy;
  secp256k1_ge pub;
  uchar seed [32];
  secp256k1_scalar sigs;
  secp256k1_scalar sigr;
  secp256k1_scalar msg;
  secp256k1_scalar nonce;
  secp256k1_scalar key;
  secp256k1_gej pubj;
  int iStackY_254;
  _func_void_char_ptr_void_ptr *p_StackY_250;
  void *pvStackY_248;
  ulong uStackY_240;
  uint64_t auStackY_238 [4];
  secp256k1_context *psStackY_218;
  secp256k1_context *psStackY_210;
  secp256k1_context *psStackY_208;
  secp256k1_context *psStackY_200;
  undefined4 local_1ec;
  secp256k1_context *local_1e8;
  int local_1dc;
  secp256k1_context *local_1d8;
  secp256k1_ge local_1d0;
  uchar local_178 [32];
  undefined1 local_158 [64];
  undefined1 local_118 [96];
  secp256k1_gej local_b8;
  
  psVar7 = (secp256k1_context *)(ulong)(uint)use_prealloc;
  local_1ec = 0;
  local_178[0x10] = '\0';
  local_178[0x11] = '\0';
  local_178[0x12] = '\0';
  local_178[0x13] = '\0';
  local_178[0x14] = '\0';
  local_178[0x15] = '\0';
  local_178[0x16] = '\0';
  local_178[0x17] = '\0';
  local_178[0x18] = '\0';
  local_178[0x19] = '\0';
  local_178[0x1a] = '\0';
  local_178[0x1b] = '\0';
  local_178[0x1c] = '\0';
  local_178[0x1d] = '\0';
  local_178[0x1e] = '\0';
  local_178[0x1f] = '\0';
  local_178[0] = '\x17';
  local_178[1] = '\0';
  local_178[2] = '\0';
  local_178[3] = '\0';
  local_178[4] = '\0';
  local_178[5] = '\0';
  local_178[6] = '\0';
  local_178[7] = '\0';
  local_178[8] = '\0';
  local_178[9] = '\0';
  local_178[10] = '\0';
  local_178[0xb] = '\0';
  local_178[0xc] = '\0';
  local_178[0xd] = '\0';
  local_178[0xe] = '\0';
  local_178[0xf] = '\0';
  psStackY_200 = (secp256k1_context *)0x139b3c;
  psVar5 = secp256k1_context_create(1);
  if (use_prealloc == 0) {
    psStackY_200 = (secp256k1_context *)0x139bbc;
    psVar6 = secp256k1_context_create(1);
    local_1e8 = (secp256k1_context *)0x0;
  }
  else {
    local_b8.x.n[0] = 0x4d430002;
    local_b8.x.n[1] = 0;
    local_b8.x.n[2] = 0;
    local_b8.x.n[3] = 0;
    local_b8.x.n[4] = 0;
    local_b8.y.n[0] = 0;
    local_1d0.x.n[0] = 0;
    psStackY_200 = (secp256k1_context *)0x139b92;
    psVar6 = (secp256k1_context *)malloc(0xd0);
    if (psVar6 == (secp256k1_context *)0x0) goto LAB_0013a174;
    psStackY_200 = (secp256k1_context *)0x139bad;
    local_1e8 = psVar6;
    psVar6 = secp256k1_context_preallocated_create(psVar6,1);
  }
  psStackY_200 = (secp256k1_context *)0x139bd3;
  iVar4 = context_eq(psVar6,psVar5);
  if (iVar4 == 0) {
    psStackY_200 = (secp256k1_context *)0x13a0b4;
    run_proper_context_tests_cold_33();
LAB_0013a0b4:
    psStackY_200 = (secp256k1_context *)0x13a0bc;
    run_proper_context_tests_cold_2();
  }
  else {
    uVar2 = (psVar6->ecmult_gen_ctx).built;
    unaff_RBX = (code *)(ulong)uVar2;
    if (uVar2 == 0) goto LAB_0013a0b4;
    psStackY_200 = (secp256k1_context *)0x139bf6;
    secp256k1_ecmult_gen_blind(&psVar6->ecmult_gen_ctx,local_178);
  }
  if ((int)unaff_RBX == 0) {
    psStackY_200 = (secp256k1_context *)0x13a0c6;
    run_proper_context_tests_cold_32();
LAB_0013a0c6:
    psStackY_200 = (secp256k1_context *)0x13a0cb;
    run_proper_context_tests_cold_3();
LAB_0013a0cb:
    psStackY_200 = (secp256k1_context *)0x13a0d0;
    run_proper_context_tests_cold_4();
  }
  else {
    psStackY_200 = (secp256k1_context *)0x139c09;
    iVar4 = context_eq(psVar6,psVar5);
    if (iVar4 != 0) goto LAB_0013a0c6;
    uVar2 = (psVar6->ecmult_gen_ctx).built;
    unaff_RBX = (code *)(ulong)uVar2;
    if (uVar2 == 0) goto LAB_0013a0cb;
    psStackY_200 = (secp256k1_context *)0x139c26;
    secp256k1_ecmult_gen_blind(&psVar6->ecmult_gen_ctx,(uchar *)0x0);
  }
  if ((int)unaff_RBX == 0) {
    psStackY_200 = (secp256k1_context *)0x13a0da;
    run_proper_context_tests_cold_31();
LAB_0013a0da:
    psStackY_200 = (secp256k1_context *)0x13a0df;
    run_proper_context_tests_cold_30();
LAB_0013a0df:
    psStackY_200 = (secp256k1_context *)0x13a0e7;
    run_proper_context_tests_cold_5();
  }
  else {
    psStackY_200 = (secp256k1_context *)0x139c39;
    iVar4 = context_eq(psVar6,psVar5);
    if (iVar4 == 0) goto LAB_0013a0da;
    if (secp256k1_context_static == psVar6) goto LAB_0013a0df;
    (psVar6->error_callback).fn = secp256k1_default_illegal_callback_fn;
    (psVar6->error_callback).data = (void *)0x0;
  }
  p_Var3 = (psVar6->error_callback).fn;
  unaff_R14 = secp256k1_default_error_callback_fn;
  if (p_Var3 == secp256k1_default_error_callback_fn) {
    psStackY_200 = (secp256k1_context *)0x13a0f1;
    run_proper_context_tests_cold_29();
LAB_0013a0f1:
    psStackY_200 = (secp256k1_context *)0x13a0f6;
    run_proper_context_tests_cold_6();
  }
  else {
    unaff_RBX = secp256k1_default_illegal_callback_fn;
    if (p_Var3 != secp256k1_default_illegal_callback_fn) goto LAB_0013a0f1;
    uVar2 = (psVar6->ecmult_gen_ctx).built;
    unaff_RBP = (secp256k1_context *)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_00139c99;
  }
  psStackY_200 = (secp256k1_context *)0x13a0fe;
  run_proper_context_tests_cold_7();
LAB_00139c99:
  local_b8.x.n[0] = 0x4d430002;
  local_b8.x.n[1] = 0;
  local_b8.x.n[2] = 0;
  local_b8.x.n[3] = 0;
  local_b8.x.n[4] = 0;
  local_b8.y.n[0] = 0;
  local_1d0.x.n[0] = 0;
  if ((int)unaff_RBP == 0) {
    psStackY_200 = (secp256k1_context *)0x13a108;
    run_proper_context_tests_cold_28();
    goto LAB_0013a108;
  }
  local_1dc = use_prealloc;
  if (use_prealloc == 0) {
    local_b8.x.n[0] = 0x4d430002;
    local_b8.x.n[1] = 0;
    local_b8.x.n[2] = 0;
    local_b8.x.n[3] = 0;
    local_b8.x.n[4] = 0;
    local_b8.y.n[0] = 0;
    local_1d0.x.n[0] = 0;
    psStackY_200 = (secp256k1_context *)0x139e0b;
    psVar8 = (secp256k1_context *)malloc(0xd0);
    if (psVar8 == (secp256k1_context *)0x0) goto LAB_0013a198;
    if ((psVar6->ecmult_gen_ctx).built == 0) goto LAB_0013a19d;
    psStackY_200 = (secp256k1_context *)0x139e34;
    memcpy(psVar8,psVar6,0xd0);
    psVar7 = psVar8;
    goto LAB_00139e37;
  }
  psStackY_200 = (secp256k1_context *)0x139cfb;
  psVar7 = secp256k1_context_clone(psVar6);
  psStackY_200 = (secp256k1_context *)0x139d09;
  iVar4 = context_eq(psVar6,psVar7);
  if (iVar4 == 0) goto LAB_0013a179;
  psStackY_200 = (secp256k1_context *)0x139d19;
  secp256k1_context_preallocated_destroy(psVar6);
  psStackY_200 = (secp256k1_context *)0x139d23;
  free(local_1e8);
  local_b8.x.n[0] = 0x4d430002;
  local_b8.x.n[1] = 0;
  local_b8.x.n[2] = 0;
  local_b8.x.n[3] = 0;
  local_b8.x.n[4] = 0;
  local_b8.y.n[0] = 0;
  local_1d0.x.n[0] = 0;
  psStackY_200 = (secp256k1_context *)0x139d71;
  psVar6 = (secp256k1_context *)malloc(0xd0);
  if (psVar6 == (secp256k1_context *)0x0) goto LAB_0013a17e;
  local_1e8 = psVar6;
  if ((psVar7->ecmult_gen_ctx).built == 0) goto LAB_0013a183;
  psStackY_200 = (secp256k1_context *)0x139d9d;
  memcpy(psVar6,psVar7,0xd0);
  while( true ) {
    psStackY_200 = (secp256k1_context *)0x139da8;
    iVar4 = context_eq(psVar7,psVar6);
    if (iVar4 == 0) break;
    psStackY_200 = (secp256k1_context *)0x139db8;
    secp256k1_context_destroy(psVar7);
    psVar8 = psVar7;
LAB_00139e83:
    psVar11 = (secp256k1_context *)(psVar6->error_callback).fn;
    psVar7 = psVar8;
    if (psVar11 == (secp256k1_context *)unaff_R14) {
LAB_0013a108:
      psStackY_200 = (secp256k1_context *)0x13a10d;
      run_proper_context_tests_cold_24();
LAB_0013a10d:
      psStackY_200 = (secp256k1_context *)0x13a112;
      run_proper_context_tests_cold_13();
LAB_0013a112:
      psStackY_200 = (secp256k1_context *)0x13a11a;
      run_proper_context_tests_cold_14();
    }
    else {
      if (psVar11 != (secp256k1_context *)unaff_RBX) goto LAB_0013a10d;
      if (secp256k1_context_static == psVar6) goto LAB_0013a112;
      (psVar6->error_callback).fn = unaff_R14;
      (psVar6->error_callback).data = (void *)0x0;
    }
    if ((secp256k1_context *)(psVar6->error_callback).fn == (secp256k1_context *)unaff_R14) {
      psStackY_200 = (secp256k1_context *)0x139ed3;
      iVar4 = context_eq(psVar6,psVar5);
      if (iVar4 == 0) goto LAB_0013a124;
      if (secp256k1_context_static == psVar6) goto LAB_0013a129;
      (psVar6->illegal_callback).fn = counting_callback_fn;
      (psVar6->illegal_callback).data = &local_1ec;
    }
    else {
      psStackY_200 = (secp256k1_context *)0x13a124;
      run_proper_context_tests_cold_15();
LAB_0013a124:
      psStackY_200 = (secp256k1_context *)0x13a129;
      run_proper_context_tests_cold_23();
LAB_0013a129:
      psStackY_200 = (secp256k1_context *)0x13a13e;
      (*(psVar6->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar6->illegal_callback).data);
    }
    if ((psVar6->illegal_callback).fn == counting_callback_fn) {
      if ((undefined4 *)(psVar6->illegal_callback).data != &local_1ec) goto LAB_0013a148;
      pcVar10 = counting_callback_fn;
      if (secp256k1_context_static == psVar6) goto LAB_0013a14d;
      (psVar6->illegal_callback).fn = unaff_RBX;
      (psVar6->illegal_callback).data = (void *)0x0;
    }
    else {
      psStackY_200 = (secp256k1_context *)0x13a148;
      run_proper_context_tests_cold_16();
LAB_0013a148:
      psStackY_200 = (secp256k1_context *)0x13a14d;
      run_proper_context_tests_cold_17();
      pcVar10 = extraout_RAX;
LAB_0013a14d:
      psStackY_200 = (secp256k1_context *)0x13a156;
      (*pcVar10)("ctx != secp256k1_context_static");
    }
    if ((secp256k1_context *)(psVar6->illegal_callback).fn == (secp256k1_context *)unaff_RBX) {
      if ((psVar6->illegal_callback).data != (void *)0x0) goto LAB_0013a160;
      psStackY_200 = (secp256k1_context *)0x139f73;
      iVar4 = context_eq(psVar6,psVar5);
      if (iVar4 == 0) goto LAB_0013a165;
      psVar7 = (secp256k1_context *)local_118;
      psStackY_200 = (secp256k1_context *)0x139f90;
      local_1d8 = psVar5;
      testutil_random_scalar_order_test((secp256k1_scalar *)psVar7);
      psVar5 = (secp256k1_context *)(local_118 + 0x40);
      psStackY_200 = (secp256k1_context *)0x139fa0;
      testutil_random_scalar_order_test((secp256k1_scalar *)psVar5);
      psStackY_200 = (secp256k1_context *)0x139fb6;
      secp256k1_ecmult_gen(&psVar6->ecmult_gen_ctx,&local_b8,(secp256k1_scalar *)psVar5);
      psStackY_200 = (secp256k1_context *)0x139fc3;
      secp256k1_ge_set_gej(&local_1d0,&local_b8);
      unaff_RBP = (secp256k1_context *)(local_118 + 0x20);
      unaff_R14 = (code *)(local_158 + 0x20);
      unaff_RBX = (code *)local_158;
      do {
        psStackY_200 = (secp256k1_context *)0x139fe3;
        testutil_random_scalar_order_test((secp256k1_scalar *)unaff_RBP);
        psStackY_200 = (secp256k1_context *)0x13a002;
        iVar4 = secp256k1_ecdsa_sig_sign
                          (&psVar6->ecmult_gen_ctx,(secp256k1_scalar *)unaff_R14,
                           (secp256k1_scalar *)unaff_RBX,(secp256k1_scalar *)psVar5,
                           (secp256k1_scalar *)psVar7,(secp256k1_scalar *)unaff_RBP,(int *)0x0);
      } while (iVar4 == 0);
      psStackY_200 = (secp256k1_context *)0x13a03e;
      iVar4 = secp256k1_ecdsa_sig_sign
                        (&psVar6->ecmult_gen_ctx,(secp256k1_scalar *)(local_158 + 0x20),
                         (secp256k1_scalar *)local_158,(secp256k1_scalar *)(local_118 + 0x40),
                         (secp256k1_scalar *)local_118,(secp256k1_scalar *)(local_118 + 0x20),
                         (int *)0x0);
      if (iVar4 == 0) goto LAB_0013a16a;
      psStackY_200 = (secp256k1_context *)0x13a068;
      iVar4 = secp256k1_ecdsa_sig_verify
                        ((secp256k1_scalar *)(local_158 + 0x20),(secp256k1_scalar *)local_158,
                         &local_1d0,(secp256k1_scalar *)local_118);
      if (iVar4 != 0) {
        if (local_1dc == 0) {
          psStackY_200 = (secp256k1_context *)0x13a093;
          secp256k1_context_destroy(psVar6);
        }
        else {
          psStackY_200 = (secp256k1_context *)0x13a07f;
          secp256k1_context_preallocated_destroy(psVar6);
          psStackY_200 = (secp256k1_context *)0x13a089;
          free(local_1e8);
        }
        psStackY_200 = (secp256k1_context *)0x13a09d;
        secp256k1_context_destroy(local_1d8);
        return;
      }
    }
    else {
      psStackY_200 = (secp256k1_context *)0x13a160;
      run_proper_context_tests_cold_18();
LAB_0013a160:
      psStackY_200 = (secp256k1_context *)0x13a165;
      run_proper_context_tests_cold_19();
LAB_0013a165:
      psStackY_200 = (secp256k1_context *)0x13a16a;
      run_proper_context_tests_cold_22();
LAB_0013a16a:
      psStackY_200 = (secp256k1_context *)0x13a16f;
      run_proper_context_tests_cold_21();
    }
    psStackY_200 = (secp256k1_context *)0x13a174;
    run_proper_context_tests_cold_20();
LAB_0013a174:
    psStackY_200 = (secp256k1_context *)0x13a179;
    run_proper_context_tests_cold_1();
LAB_0013a179:
    psStackY_200 = (secp256k1_context *)0x13a17e;
    run_proper_context_tests_cold_11();
LAB_0013a17e:
    psStackY_200 = (secp256k1_context *)0x13a183;
    run_proper_context_tests_cold_10();
LAB_0013a183:
    psStackY_200 = (secp256k1_context *)0x13a18b;
    run_proper_context_tests_cold_8();
    psVar6 = (secp256k1_context *)0x0;
  }
  psStackY_200 = (secp256k1_context *)0x13a198;
  run_proper_context_tests_cold_9();
LAB_0013a198:
  psVar8 = psVar7;
  psVar5 = unaff_RBP;
  psStackY_200 = (secp256k1_context *)0x13a19d;
  run_proper_context_tests_cold_27();
LAB_0013a19d:
  psStackY_200 = (secp256k1_context *)0x13a1a5;
  run_proper_context_tests_cold_12();
  psVar7 = (secp256k1_context *)0x0;
LAB_00139e37:
  psStackY_200 = (secp256k1_context *)0x139e42;
  psVar11 = psVar6;
  iVar4 = context_eq(psVar6,psVar7);
  if (iVar4 == 0) {
    psStackY_200 = (secp256k1_context *)0x13a1b2;
    run_proper_context_tests_cold_26();
  }
  else {
    psStackY_200 = (secp256k1_context *)0x139e52;
    secp256k1_context_destroy(psVar6);
    psStackY_200 = (secp256k1_context *)0x139e5a;
    psVar6 = secp256k1_context_clone(psVar7);
    psStackY_200 = (secp256k1_context *)0x139e68;
    psVar11 = psVar7;
    iVar4 = context_eq(psVar7,psVar6);
    if (iVar4 != 0) {
      psStackY_200 = (secp256k1_context *)0x139e78;
      secp256k1_context_preallocated_destroy(psVar7);
      psStackY_200 = (secp256k1_context *)0x139e80;
      free(psVar8);
      unaff_RBP = psVar5;
      goto LAB_00139e83;
    }
  }
  psStackY_200 = (secp256k1_context *)run_static_context_tests;
  run_proper_context_tests_cold_25();
  psVar8 = STATIC_CTX;
  psVar7 = secp256k1_context_static;
  psStackY_218 = (secp256k1_context *)unaff_RBX;
  psStackY_210 = (secp256k1_context *)unaff_R14;
  psStackY_208 = psVar6;
  psStackY_200 = psVar5;
  if (secp256k1_context_no_precomp == secp256k1_context_static) {
    psVar11 = (secp256k1_context *)((ulong)psVar11 & 0xffffffff);
    auStackY_238[1] = 0;
    auStackY_238[2] = 0;
    uStackY_240 = 0x17;
    auStackY_238[0] = 0;
    iStackY_254 = 0;
    p_StackY_250 = (STATIC_CTX->illegal_callback).fn;
    pvStackY_248 = (STATIC_CTX->illegal_callback).data;
    psVar5 = STATIC_CTX;
    if (secp256k1_context_static == STATIC_CTX) goto LAB_0013a4db;
    (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
    psVar7 = (secp256k1_context *)&iStackY_254;
    (psVar8->illegal_callback).data = psVar7;
  }
  else {
    run_static_context_tests_cold_1();
    psVar5 = extraout_RAX_01;
    psVar11 = (secp256k1_context *)unaff_RBX;
LAB_0013a4db:
    (*(psVar5->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
  }
  if ((STATIC_CTX->ecmult_gen_ctx).built == 0) {
    run_static_context_tests_cold_2();
    psVar5 = STATIC_CTX;
    (STATIC_CTX->illegal_callback).fn = p_StackY_250;
    (psVar5->illegal_callback).data = pvStackY_248;
    if (iStackY_254 != 1) goto LAB_0013a503;
    psVar7 = (secp256k1_context *)&psVar5->illegal_callback;
    iStackY_254 = 0;
    p_StackY_250 = ((secp256k1_callback *)psVar7)->fn;
    pvStackY_248 = (psVar5->illegal_callback).data;
    if (secp256k1_context_static == psVar5) goto LAB_0013a508;
    (psVar5->illegal_callback).fn = counting_callback_fn;
    psVar7 = (secp256k1_context *)&iStackY_254;
    (psVar5->illegal_callback).data = psVar7;
  }
  else {
    secp256k1_ecmult_gen_blind(&STATIC_CTX->ecmult_gen_ctx,(uchar *)&uStackY_240);
    run_static_context_tests_cold_3();
LAB_0013a503:
    run_static_context_tests_cold_4();
    psVar5 = extraout_RAX_02;
LAB_0013a508:
    (*(psVar5->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
  }
  if ((STATIC_CTX->ecmult_gen_ctx).built == 0) {
    run_static_context_tests_cold_5();
    psVar5 = STATIC_CTX;
    (STATIC_CTX->illegal_callback).fn = p_StackY_250;
    (psVar5->illegal_callback).data = pvStackY_248;
    if (iStackY_254 != 1) goto LAB_0013a530;
    psVar7 = (secp256k1_context *)&psVar5->illegal_callback;
    if ((int)psVar11 != 0) {
      iStackY_254 = 0;
      p_StackY_250 = ((secp256k1_callback *)psVar7)->fn;
      pvStackY_248 = (psVar5->illegal_callback).data;
      if (secp256k1_context_static == psVar5) goto LAB_0013a535;
      (psVar5->illegal_callback).fn = counting_callback_fn;
      psVar7 = (secp256k1_context *)&iStackY_254;
      (psVar5->illegal_callback).data = psVar7;
      goto LAB_0013a32c;
    }
  }
  else {
    secp256k1_ecmult_gen_blind(&STATIC_CTX->ecmult_gen_ctx,(uchar *)0x0);
    run_static_context_tests_cold_6();
LAB_0013a530:
    run_static_context_tests_cold_7();
    psVar5 = extraout_RAX_03;
LAB_0013a535:
    (*(psVar5->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
LAB_0013a32c:
    if ((STATIC_CTX->ecmult_gen_ctx).built == 0) {
      (*(STATIC_CTX->illegal_callback).fn)
                ("secp256k1_context_is_proper(ctx)",(STATIC_CTX->illegal_callback).data);
      unaff_R14 = (code *)STATIC_CTX;
      (STATIC_CTX->illegal_callback).fn = p_StackY_250;
      (((secp256k1_context *)unaff_R14)->illegal_callback).data = pvStackY_248;
      if (iStackY_254 != 1) goto LAB_0013a741;
      psVar7 = (secp256k1_context *)malloc(0xd0);
      if (psVar7 == (secp256k1_context *)0x0) goto LAB_0013a746;
      memset(psVar7,0x2a,0xd0);
      iStackY_254 = 0;
      p_StackY_250 = (((secp256k1_context *)unaff_R14)->illegal_callback).fn;
      pvStackY_248 = (((secp256k1_context *)unaff_R14)->illegal_callback).data;
      if (secp256k1_context_static == (secp256k1_context *)unaff_R14) goto LAB_0013a74b;
      (((secp256k1_context *)unaff_R14)->illegal_callback).fn = counting_callback_fn;
      (((secp256k1_context *)unaff_R14)->illegal_callback).data = &iStackY_254;
      goto LAB_0013a5e8;
    }
    run_static_context_tests_cold_8();
    psVar5 = extraout_RAX_00;
  }
  iStackY_254 = 0;
  p_StackY_250 = *(_func_void_char_ptr_void_ptr **)&psVar7->ecmult_gen_ctx;
  pvStackY_248 = (void *)(psVar7->ecmult_gen_ctx).scalar_offset.d[0];
  psVar7 = psVar11;
  if (secp256k1_context_static == psVar5) goto LAB_0013a6c5;
  (psVar5->illegal_callback).fn = counting_callback_fn;
  (psVar5->illegal_callback).data = &iStackY_254;
  while (psVar6 = secp256k1_context_clone(STATIC_CTX), psVar5 = STATIC_CTX,
        psVar6 == (secp256k1_context *)0x0) {
    (STATIC_CTX->illegal_callback).fn = p_StackY_250;
    (psVar5->illegal_callback).data = pvStackY_248;
    if (iStackY_254 != 1) goto LAB_0013a6e3;
    iStackY_254 = 0;
    p_StackY_250 = (psVar5->illegal_callback).fn;
    pvStackY_248 = (psVar5->illegal_callback).data;
    if (secp256k1_context_static == psVar5) goto LAB_0013a706;
    (psVar5->illegal_callback).fn = counting_callback_fn;
    (psVar5->illegal_callback).data = &iStackY_254;
LAB_0013a3e9:
    secp256k1_context_destroy(STATIC_CTX);
    psVar5 = STATIC_CTX;
    (STATIC_CTX->illegal_callback).fn = p_StackY_250;
    (psVar5->illegal_callback).data = pvStackY_248;
    if (iStackY_254 != 1) {
      run_static_context_tests_cold_18();
      goto LAB_0013a724;
    }
    do {
      psVar5 = STATIC_CTX;
      uStackY_240 = uStackY_240 & 0xffffffff00000000;
      if (secp256k1_context_static == STATIC_CTX) {
LAB_0013a6e8:
        (*(psVar5->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
      }
      else {
        (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
        (psVar5->illegal_callback).data = &uStackY_240;
      }
      psVar5 = STATIC_CTX;
      if ((STATIC_CTX->illegal_callback).fn != counting_callback_fn) goto LAB_0013a701;
      if ((ulong *)(STATIC_CTX->illegal_callback).data == &uStackY_240) {
        pcVar10 = counting_callback_fn;
        if (secp256k1_context_static == STATIC_CTX) goto LAB_0013a729;
        (STATIC_CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
        (psVar5->illegal_callback).data = (void *)0x0;
      }
      else {
LAB_0013a724:
        run_static_context_tests_cold_20();
        pcVar10 = extraout_RAX_07;
LAB_0013a729:
        (*pcVar10)("ctx != secp256k1_context_static");
      }
      if ((STATIC_CTX->illegal_callback).fn == secp256k1_default_illegal_callback_fn) {
        if ((STATIC_CTX->illegal_callback).data == (void *)0x0) {
          return;
        }
      }
      else {
        run_static_context_tests_cold_21();
      }
      run_static_context_tests_cold_22();
      psVar11 = psVar7;
LAB_0013a741:
      run_static_context_tests_cold_9();
LAB_0013a746:
      psVar7 = psVar11;
      run_static_context_tests_cold_15();
LAB_0013a74b:
      (*(((secp256k1_context *)unaff_R14)->illegal_callback).fn)
                ("ctx != secp256k1_context_static",
                 (((secp256k1_context *)unaff_R14)->illegal_callback).data);
LAB_0013a5e8:
      if ((STATIC_CTX->ecmult_gen_ctx).built == 0) {
        run_static_context_tests_cold_10();
        unaff_R14 = (code *)STATIC_CTX;
        (STATIC_CTX->illegal_callback).fn = p_StackY_250;
        (((secp256k1_context *)unaff_R14)->illegal_callback).data = pvStackY_248;
        if (iStackY_254 != 1) goto LAB_0013a777;
        lVar9 = 0;
        do {
          cVar1 = *(char *)((long)(psVar7->ecmult_gen_ctx).scalar_offset.d + lVar9 + -8);
          if (cVar1 != '*') break;
          bVar12 = lVar9 != 0xcf;
          lVar9 = lVar9 + 1;
        } while (bVar12);
        if (cVar1 != '*') goto LAB_0013a77c;
        free(psVar7);
        iStackY_254 = 0;
        p_StackY_250 = (((secp256k1_context *)unaff_R14)->illegal_callback).fn;
        pvStackY_248 = (((secp256k1_context *)unaff_R14)->illegal_callback).data;
        if (secp256k1_context_static == (secp256k1_context *)unaff_R14) goto LAB_0013a781;
        (((secp256k1_context *)unaff_R14)->illegal_callback).fn = counting_callback_fn;
        (((secp256k1_context *)unaff_R14)->illegal_callback).data = &iStackY_254;
      }
      else {
        memcpy(psVar7,STATIC_CTX,0xd0);
        run_static_context_tests_cold_11();
LAB_0013a777:
        run_static_context_tests_cold_12();
LAB_0013a77c:
        run_static_context_tests_cold_14();
LAB_0013a781:
        (*(((secp256k1_context *)unaff_R14)->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",
                   (((secp256k1_context *)unaff_R14)->illegal_callback).data);
      }
      secp256k1_context_preallocated_destroy(STATIC_CTX);
      psVar5 = STATIC_CTX;
      (STATIC_CTX->illegal_callback).fn = p_StackY_250;
      (psVar5->illegal_callback).data = pvStackY_248;
    } while (iStackY_254 == 1);
    run_static_context_tests_cold_13();
    psVar5 = extraout_RAX_04;
LAB_0013a6c5:
    (*(psVar5->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
  }
  run_static_context_tests_cold_16();
LAB_0013a6e3:
  run_static_context_tests_cold_17();
  psVar5 = extraout_RAX_05;
  goto LAB_0013a6e8;
LAB_0013a701:
  run_static_context_tests_cold_19();
  psVar5 = extraout_RAX_06;
LAB_0013a706:
  (*(psVar5->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
  goto LAB_0013a3e9;
}

Assistant:

static void run_proper_context_tests(int use_prealloc) {
    int32_t dummy = 0;
    secp256k1_context *my_ctx, *my_ctx_fresh;
    void *my_ctx_prealloc = NULL;
    unsigned char seed[32] = {0x17};

    secp256k1_gej pubj;
    secp256k1_ge pub;
    secp256k1_scalar msg, key, nonce;
    secp256k1_scalar sigr, sigs;

    /* Fresh reference context for comparison */
    my_ctx_fresh = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    if (use_prealloc) {
        my_ctx_prealloc = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
        CHECK(my_ctx_prealloc != NULL);
        my_ctx = secp256k1_context_preallocated_create(my_ctx_prealloc, SECP256K1_CONTEXT_NONE);
    } else {
        my_ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    }

    /* Randomize and reset randomization */
    CHECK(context_eq(my_ctx, my_ctx_fresh));
    CHECK(secp256k1_context_randomize(my_ctx, seed) == 1);
    CHECK(!context_eq(my_ctx, my_ctx_fresh));
    CHECK(secp256k1_context_randomize(my_ctx, NULL) == 1);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /* set error callback (to a function that still aborts in case malloc() fails in secp256k1_context_clone() below) */
    secp256k1_context_set_error_callback(my_ctx, secp256k1_default_illegal_callback_fn, NULL);
    CHECK(my_ctx->error_callback.fn != secp256k1_default_error_callback_fn);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn);

    /* check if sizes for cloning are consistent */
    CHECK(secp256k1_context_preallocated_clone_size(my_ctx) == secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));

    /*** clone and destroy all of them to make sure cloning was complete ***/
    {
        secp256k1_context *ctx_tmp;

        if (use_prealloc) {
            /* clone into a non-preallocated context and then again into a new preallocated one. */
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_clone(my_ctx);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_preallocated_destroy(ctx_tmp);

            free(my_ctx_prealloc);
            my_ctx_prealloc = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
            CHECK(my_ctx_prealloc != NULL);
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_preallocated_clone(my_ctx, my_ctx_prealloc);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_destroy(ctx_tmp);
        } else {
            /* clone into a preallocated context and then again into a new non-preallocated one. */
            void *prealloc_tmp;

            prealloc_tmp = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
            CHECK(prealloc_tmp != NULL);
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_preallocated_clone(my_ctx, prealloc_tmp);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_destroy(ctx_tmp);

            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_clone(my_ctx);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_preallocated_destroy(ctx_tmp);
            free(prealloc_tmp);
        }
    }

    /* Verify that the error callback makes it across the clone. */
    CHECK(my_ctx->error_callback.fn != secp256k1_default_error_callback_fn);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn);
    /* And that it resets back to default. */
    secp256k1_context_set_error_callback(my_ctx, NULL, NULL);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_error_callback_fn);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /* Verify that setting and resetting illegal callback works */
    secp256k1_context_set_illegal_callback(my_ctx, counting_callback_fn, &dummy);
    CHECK(my_ctx->illegal_callback.fn == counting_callback_fn);
    CHECK(my_ctx->illegal_callback.data == &dummy);
    secp256k1_context_set_illegal_callback(my_ctx, NULL, NULL);
    CHECK(my_ctx->illegal_callback.fn == secp256k1_default_illegal_callback_fn);
    CHECK(my_ctx->illegal_callback.data == NULL);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /*** attempt to use them ***/
    testutil_random_scalar_order_test(&msg);
    testutil_random_scalar_order_test(&key);
    secp256k1_ecmult_gen(&my_ctx->ecmult_gen_ctx, &pubj, &key);
    secp256k1_ge_set_gej(&pub, &pubj);

    /* obtain a working nonce */
    do {
        testutil_random_scalar_order_test(&nonce);
    } while(!secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL));

    /* try signing */
    CHECK(secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL));

    /* try verifying */
    CHECK(secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg));

    /* cleanup */
    if (use_prealloc) {
        secp256k1_context_preallocated_destroy(my_ctx);
        free(my_ctx_prealloc);
    } else {
        secp256k1_context_destroy(my_ctx);
    }
    secp256k1_context_destroy(my_ctx_fresh);

    /* Defined as no-op. */
    secp256k1_context_destroy(NULL);
    secp256k1_context_preallocated_destroy(NULL);
}